

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall
fmt::v10::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v10 *this,string_view fmt,format_args args)

{
  type args_00;
  basic_string_view<char> fmt_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  allocator<char> local_251;
  undefined1 local_250 [8];
  memory_buffer buffer;
  format_args args_local;
  string_view fmt_local;
  
  buffer._528_8_ = fmt.size_;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250,&local_251);
  std::allocator<char>::~allocator(&local_251);
  fmt_00.size_ = (size_t)fmt.data_;
  fmt_00.data_ = (char *)this;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
          )args.desc_;
  args_00.desc_._0_1_ = buffer.store_[0x1f0];
  args_00.desc_._1_1_ = buffer.store_[0x1f1];
  args_00.desc_._2_1_ = buffer.store_[0x1f2];
  args_00.desc_._3_1_ = buffer.store_[499];
  args_00.desc_._4_1_ = buffer.alloc_;
  args_00.desc_._5_3_ = buffer._533_3_;
  detail::vformat_to<char>((buffer<char> *)local_250,fmt_00,args_00,(locale_ref)0x0);
  to_string<char,500ul>(__return_storage_ptr__,(v10 *)local_250,buf);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto vformat(string_view fmt, format_args args) -> std::string {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}